

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall
GlobOpt::OptIsInvariant
          (GlobOpt *this,Instr *instr,BasicBlock *block,Loop *loop,Value *src1Val,Value *src2Val,
          bool isNotTypeSpecConv,bool forceInvariantHoisting)

{
  OpCode OVar1;
  Func *pFVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  bool bVar6;
  undefined4 *puVar7;
  PropertySymOpnd *this_00;
  PropertySym *pPVar8;
  StackSym *sym;
  Value *srcVal;
  LabelInstr *pLVar9;
  
  bVar4 = Loop::CanHoistInvariants(loop);
  if (!bVar4) {
    return false;
  }
  bVar4 = OpCodeAttr::CanCSE(instr->m_opcode);
  if (!bVar4) {
    return false;
  }
  bVar4 = OpCodeAttr::OpndHasImplicitCall(instr->m_opcode);
  bVar4 = !bVar4;
  OVar1 = instr->m_opcode;
  if (OVar1 < Ld_I4) {
    if (ProfiledIsIn < OVar1) {
      if (OVar1 == LdArgumentsFromFrame) {
        pFVar2 = instr->m_func;
        pLVar9 = Loop::GetLoopTopInstr(loop);
        if (pFVar2 != (pLVar9->super_Instr).m_func) {
          return false;
        }
      }
      else if (OVar1 == FromVar) {
        bVar4 = (bool)(bVar4 | (instr->field_0x38 & 0x10) >> 4);
      }
      goto LAB_0046f27c;
    }
    if (OVar1 != Ld_A) {
      if (OVar1 == LdLen_A) {
        return false;
      }
      goto LAB_0046f27c;
    }
  }
  else if (1 < OVar1 - 0x1e4) {
    if (OVar1 == BailOnNotStackArgs) {
      return false;
    }
    if (OVar1 == CheckObjType) {
      if (instr->m_src1 == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3a4c,"(instr->GetSrc1())","instr->GetSrc1()");
        if (!bVar6) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
      }
      this_00 = IR::Opnd::AsPropertySymOpnd(instr->m_src1);
      pPVar8 = IR::PropertySymOpnd::GetPropertySym(this_00);
      bVar6 = StackSym::HasObjectTypeSym(pPVar8->m_stackSym);
      if (bVar6) {
        sym = StackSym::GetObjectTypeSym(pPVar8->m_stackSym);
        srcVal = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,&sym->super_Sym);
        bVar6 = OptIsInvariant(this,&sym->super_Sym,block,loop,srcVal,true,true,(Value **)0x0);
        if (!bVar6) {
          return false;
        }
      }
    }
    goto LAB_0046f27c;
  }
  if (!forceInvariantHoisting) {
    return false;
  }
LAB_0046f27c:
  if ((instr->m_dst == (Opnd *)0x0) ||
     (OVar5 = IR::Opnd::GetKind(instr->m_dst), OVar5 == OpndKindReg)) {
    if (instr->m_src1 == (Opnd *)0x0) {
      return true;
    }
    bVar6 = OptIsInvariant(this,instr->m_src1,block,loop,src1Val,isNotTypeSpecConv,bVar4);
    if (bVar6) {
      if (instr->m_src2 == (Opnd *)0x0) {
        return true;
      }
      bVar4 = OptIsInvariant(this,instr->m_src2,block,loop,src2Val,isNotTypeSpecConv,bVar4);
      if (bVar4) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::OptIsInvariant(
    IR::Instr *instr,
    BasicBlock *block,
    Loop *loop,
    Value *src1Val,
    Value *src2Val,
    bool isNotTypeSpecConv,
    const bool forceInvariantHoisting)
{
    if (!loop->CanHoistInvariants())
    {
        return false;
    }
    if (!OpCodeAttr::CanCSE(instr->m_opcode))
    {
        return false;
    }

    bool allowNonPrimitives = !OpCodeAttr::OpndHasImplicitCall(instr->m_opcode);

    switch(instr->m_opcode)
    {
        // Can't legally hoist these
    case Js::OpCode::LdLen_A:
        return false;

        //Can't Hoist BailOnNotStackArgs, as it is necessary as InlineArgsOptimization relies on this opcode
        //to decide whether to throw rejit exception or not.
    case Js::OpCode::BailOnNotStackArgs:
        return false;

        // Usually not worth hoisting these
    case Js::OpCode::Ld_A:
    case Js::OpCode::Ld_I4:
    case Js::OpCode::LdC_A_I4:
        if(!forceInvariantHoisting)
        {
            return false;
        }
        break;

        // Can't hoist these outside the function it's for. The LdArgumentsFromFrame for an inlinee depends on the inlinee meta arg
        // that holds the arguments object, which is only initialized at the start of the inlinee. So, can't hoist this outside the
        // inlinee.
    case Js::OpCode::LdArgumentsFromFrame:
        if(instr->m_func != loop->GetFunc())
        {
            return false;
        }
        break;

    case Js::OpCode::FromVar:
        if (instr->HasBailOutInfo())
        {
            allowNonPrimitives = true;
        }
        break;
    case Js::OpCode::CheckObjType:
        // Bug 11712101: If the operand is a field, ensure that its containing object type is invariant
        // before hoisting -- that is, don't hoist a CheckObjType over a DeleteFld on that object.
        // (CheckObjType only checks the operand and its immediate parent, so we don't need to go
        // any farther up the object graph.)
        Assert(instr->GetSrc1());
        PropertySym *propertySym = instr->GetSrc1()->AsPropertySymOpnd()->GetPropertySym();
        if (propertySym->HasObjectTypeSym()) {
            StackSym *objectTypeSym = propertySym->GetObjectTypeSym();
            if (!this->OptIsInvariant(objectTypeSym, block, loop, this->CurrentBlockData()->FindValue(objectTypeSym), true, true)) {
                return false;
            }
        }

        break;
    }

    IR::Opnd *dst = instr->GetDst();

    if (dst && !dst->IsRegOpnd())
    {
        return false;
    }

    IR::Opnd *src1 = instr->GetSrc1();

    if (src1)
    {
        if (!this->OptIsInvariant(src1, block, loop, src1Val, isNotTypeSpecConv, allowNonPrimitives))
        {
            return false;
        }

        IR::Opnd *src2 = instr->GetSrc2();

        if (src2)
        {
            if (!this->OptIsInvariant(src2, block, loop, src2Val, isNotTypeSpecConv, allowNonPrimitives))
            {
                return false;
            }
        }
    }

    return true;
}